

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralContactClipping.cpp
# Opt level: O2

void cbtPolyhedralContactClipping::clipHullAgainstHull
               (cbtVector3 *separatingNormal1,cbtConvexPolyhedron *hullA,cbtConvexPolyhedron *hullB,
               cbtTransform *transA,cbtTransform *transB,cbtScalar minDist,cbtScalar maxDist,
               cbtVertexArray *worldVertsB1,cbtVertexArray *worldVertsB2,Result *resultOut)

{
  uint uVar1;
  cbtFace *pcVar2;
  undefined1 auVar3 [16];
  int face;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  undefined1 in_register_00001204 [60];
  undefined1 auVar12 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar15 [56];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  cbtVector3 cVar17;
  cbtVector3 cVar18;
  cbtVector3 Normal;
  cbtScalar local_68;
  cbtVector3 separatingNormal;
  
  auVar15 = in_register_00001244._4_56_;
  auVar12 = in_register_00001204._4_56_;
  cVar17 = cbtVector3::normalized(separatingNormal1);
  auVar14._0_8_ = cVar17.m_floats._8_8_;
  auVar14._8_56_ = auVar15;
  auVar9._0_8_ = cVar17.m_floats._0_8_;
  auVar9._8_56_ = auVar12;
  separatingNormal.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar9._0_16_,auVar14._0_16_);
  uVar7 = 0xffffffffffffffff;
  auVar10 = ZEXT464(0xff7fffff);
  lVar5 = 0x28;
  for (uVar4 = 0; auVar15 = auVar14._8_56_, (long)uVar4 < (long)(hullB->m_faces).m_size;
      uVar4 = uVar4 + 1) {
    pcVar2 = (hullB->m_faces).m_data;
    fVar8 = auVar10._0_4_;
    Normal.m_floats[1] = *(cbtScalar *)((long)pcVar2->m_plane + lVar5 + -0x24);
    Normal.m_floats[0] = *(cbtScalar *)((long)pcVar2->m_plane + lVar5 + -0x28);
    auVar13 = (undefined1  [56])0x0;
    Normal.m_floats[2] = *(cbtScalar *)((long)pcVar2->m_plane + lVar5 + -0x20);
    Normal.m_floats[3] = 0.0;
    cVar18 = ::operator*(&transB->m_basis,&Normal);
    auVar14._0_8_ = cVar18.m_floats._8_8_;
    auVar14._8_56_ = auVar15;
    auVar11._0_8_ = cVar18.m_floats._0_8_;
    auVar11._8_56_ = auVar13;
    auVar16._0_4_ = cVar18.m_floats[0] * cVar17.m_floats[0];
    auVar16._4_4_ = cVar18.m_floats[1] * cVar17.m_floats[1];
    auVar16._8_4_ = auVar13._0_4_ * auVar12._0_4_;
    auVar16._12_4_ = auVar13._4_4_ * auVar12._4_4_;
    auVar16 = vmovshdup_avx(auVar16);
    auVar16 = vfmadd231ss_fma(auVar16,auVar9._0_16_,auVar11._0_16_);
    local_68 = cVar17.m_floats[2];
    auVar3 = vfmadd231ss_fma(auVar16,auVar14._0_16_,ZEXT416((uint)local_68));
    auVar16 = vmaxss_avx(auVar3,ZEXT416((uint)fVar8));
    auVar10 = ZEXT1664(auVar16);
    if (fVar8 < auVar3._0_4_) {
      uVar7 = uVar4;
    }
    uVar7 = uVar7 & 0xffffffff;
    lVar5 = lVar5 + 0x30;
  }
  uVar4 = 0;
  cbtAlignedObjectArray<cbtVector3>::resize(worldVertsB1,0,&Normal);
  pcVar2 = (hullB->m_faces).m_data;
  iVar6 = (int)uVar7;
  uVar1 = pcVar2[iVar6].m_indices.m_size;
  while( true ) {
    auVar15 = auVar14._8_56_;
    auVar12 = auVar10._8_56_;
    if ((~((int)uVar1 >> 0x1f) & uVar1) == uVar4) break;
    cVar17 = cbtTransform::operator()
                       (transB,(hullB->m_vertices).m_data + pcVar2[iVar6].m_indices.m_data[uVar4]);
    auVar14._0_8_ = cVar17.m_floats._8_8_;
    auVar14._8_56_ = auVar15;
    auVar10._0_8_ = cVar17.m_floats._0_8_;
    auVar10._8_56_ = auVar12;
    Normal.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar10._0_16_,auVar14._0_16_);
    auVar10 = ZEXT1664((undefined1  [16])Normal.m_floats);
    cbtAlignedObjectArray<cbtVector3>::push_back(worldVertsB1,&Normal);
    uVar4 = uVar4 + 1;
  }
  if (-1 < iVar6) {
    clipFaceAgainstHull(&separatingNormal,hullA,transA,worldVertsB1,worldVertsB2,minDist,maxDist,
                        resultOut);
  }
  return;
}

Assistant:

void cbtPolyhedralContactClipping::clipHullAgainstHull(const cbtVector3& separatingNormal1, const cbtConvexPolyhedron& hullA, const cbtConvexPolyhedron& hullB, const cbtTransform& transA, const cbtTransform& transB, const cbtScalar minDist, cbtScalar maxDist, cbtVertexArray& worldVertsB1, cbtVertexArray& worldVertsB2, cbtDiscreteCollisionDetectorInterface::Result& resultOut)
{
	cbtVector3 separatingNormal = separatingNormal1.normalized();
	//	const cbtVector3 c0 = transA * hullA.m_localCenter;
	//	const cbtVector3 c1 = transB * hullB.m_localCenter;
	//const cbtVector3 DeltaC2 = c0 - c1;

	int closestFaceB = -1;
	cbtScalar dmax = -FLT_MAX;
	{
		for (int face = 0; face < hullB.m_faces.size(); face++)
		{
			const cbtVector3 Normal(hullB.m_faces[face].m_plane[0], hullB.m_faces[face].m_plane[1], hullB.m_faces[face].m_plane[2]);
			const cbtVector3 WorldNormal = transB.getBasis() * Normal;
			cbtScalar d = WorldNormal.dot(separatingNormal);
			if (d > dmax)
			{
				dmax = d;
				closestFaceB = face;
			}
		}
	}
	worldVertsB1.resize(0);
	{
		const cbtFace& polyB = hullB.m_faces[closestFaceB];
		const int numVertices = polyB.m_indices.size();
		for (int e0 = 0; e0 < numVertices; e0++)
		{
			const cbtVector3& b = hullB.m_vertices[polyB.m_indices[e0]];
			worldVertsB1.push_back(transB * b);
		}
	}

	if (closestFaceB >= 0)
		clipFaceAgainstHull(separatingNormal, hullA, transA, worldVertsB1, worldVertsB2, minDist, maxDist, resultOut);
}